

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_dense.cpp
# Opt level: O2

void __thiscall
test_vector_dense_scalar_division_assignment_Test::
~test_vector_dense_scalar_division_assignment_Test
          (test_vector_dense_scalar_division_assignment_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_vector_dense, scalar_division_assignment) {
  Vector_Dense<Scalar, 0> dynamic_vector = {3.0, 6.0, -5.0};
  dynamic_vector /= 3.0;
  EXPECT_DOUBLE_EQ(dynamic_vector[0], 1.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[1], 2.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[2], -5.0 / 3.0);

  Vector_Dense<Scalar, 2> static_vector = {3.0, -5.0};
  static_vector /= 4.0;
  EXPECT_DOUBLE_EQ(static_vector[0], 3.0 / 4.0);
  EXPECT_DOUBLE_EQ(static_vector[1], -5.0 / 4.0);
}